

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O0

bool __thiscall bssl::SSLTranscript::GetHash(SSLTranscript *this,uint8_t *out,size_t *out_len)

{
  int iVar1;
  EVP_MD_CTX *pEVar2;
  EVP_MD_CTX *in;
  uint local_4c;
  undefined1 local_48 [4];
  uint len;
  ScopedEVP_MD_CTX ctx;
  size_t *out_len_local;
  uint8_t *out_local;
  SSLTranscript *this_local;
  
  ctx.ctx_.pctx_ops = (evp_md_pctx_ops *)out_len;
  internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::StackAllocatedMovable
            ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
              *)local_48);
  pEVar2 = (EVP_MD_CTX *)
           internal::
           StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
           ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                  *)local_48);
  in = (EVP_MD_CTX *)
       internal::
       StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
       ::get(&this->hash_);
  iVar1 = EVP_MD_CTX_copy_ex(pEVar2,in);
  if (iVar1 != 0) {
    pEVar2 = (EVP_MD_CTX *)
             internal::
             StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
             ::get((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
                    *)local_48);
    iVar1 = EVP_DigestFinal_ex(pEVar2,out,&local_4c);
    if (iVar1 != 0) {
      (ctx.ctx_.pctx_ops)->free = (_func_void_EVP_PKEY_CTX_ptr *)(ulong)local_4c;
      this_local._7_1_ = true;
      goto LAB_001b924c;
    }
  }
  this_local._7_1_ = false;
LAB_001b924c:
  internal::
  StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
  ::~StackAllocatedMovable
            ((StackAllocatedMovable<env_md_ctx_st,_int,_&EVP_MD_CTX_init,_&EVP_MD_CTX_cleanup,_&EVP_MD_CTX_move>
              *)local_48);
  return this_local._7_1_;
}

Assistant:

bool SSLTranscript::GetHash(uint8_t *out, size_t *out_len) const {
  ScopedEVP_MD_CTX ctx;
  unsigned len;
  if (!EVP_MD_CTX_copy_ex(ctx.get(), hash_.get()) ||
      !EVP_DigestFinal_ex(ctx.get(), out, &len)) {
    return false;
  }
  *out_len = len;
  return true;
}